

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPPolicyIteration.cpp
# Opt level: O0

QTable * __thiscall MDPPolicyIteration::GetQTable(MDPPolicyIteration *this,Index time_step)

{
  undefined4 in_EDX;
  QTable *in_RSI;
  QTable *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  std::vector<QTable,_std::allocator<QTable>_>::at
            ((vector<QTable,_std::allocator<QTable>_> *)in_RDI,(size_type)in_RDI);
  QTable::QTable(in_RSI,(QTable *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  return in_RDI;
}

Assistant:

QTable MDPPolicyIteration::GetQTable(Index time_step) const
{
    return(_m_QValues.at(time_step));
}